

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIvy.c
# Opt level: O0

Vec_Int_t * Abc_NtkCollectLatchValuesIvy(Abc_Ntk_t *pNtk,int fUseDcs)

{
  int iVar1;
  Vec_Int_t *p;
  Abc_Obj_t *pObj;
  int local_2c;
  int i;
  Vec_Int_t *vArray;
  Abc_Obj_t *pLatch;
  int fUseDcs_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkLatchNum(pNtk);
  p = Vec_IntAlloc(iVar1);
  local_2c = 0;
  do {
    iVar1 = Vec_PtrSize(pNtk->vBoxes);
    if (iVar1 <= local_2c) {
      return p;
    }
    pObj = Abc_NtkBox(pNtk,local_2c);
    iVar1 = Abc_ObjIsLatch(pObj);
    if (iVar1 != 0) {
      if ((fUseDcs == 0) && (iVar1 = Abc_LatchIsInitDc(pObj), iVar1 == 0)) {
        iVar1 = Abc_LatchIsInit1(pObj);
        if (iVar1 == 0) {
          iVar1 = Abc_LatchIsInit0(pObj);
          if (iVar1 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcIvy.c"
                          ,0x473,"Vec_Int_t *Abc_NtkCollectLatchValuesIvy(Abc_Ntk_t *, int)");
          }
          Vec_IntPush(p,1);
        }
        else {
          Vec_IntPush(p,2);
        }
      }
      else {
        Vec_IntPush(p,3);
      }
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Abc_NtkCollectLatchValuesIvy( Abc_Ntk_t * pNtk, int fUseDcs )
{
    Abc_Obj_t * pLatch;
    Vec_Int_t * vArray;
    int i;
    vArray = Vec_IntAlloc( Abc_NtkLatchNum(pNtk) );
    Abc_NtkForEachLatch( pNtk, pLatch, i )
    {
        if ( fUseDcs || Abc_LatchIsInitDc(pLatch) )
            Vec_IntPush( vArray, IVY_INIT_DC );
        else if ( Abc_LatchIsInit1(pLatch) )
            Vec_IntPush( vArray, IVY_INIT_1 );
        else if ( Abc_LatchIsInit0(pLatch) )
            Vec_IntPush( vArray, IVY_INIT_0 );
        else assert( 0 );
    }
    return vArray;
}